

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void * subcanvas_new(t_symbol *s)

{
  _binbuf *x;
  int iVar1;
  _glist *p_Var2;
  _glist *gl;
  t_atom *argv;
  t_symbol *ptVar3;
  _glist *p_Var4;
  t_object *ptVar5;
  t_symbol *ptVar6;
  _class *sel;
  t_symbol *ptVar7;
  char *pcVar8;
  t_gobj *x_00;
  bool bVar9;
  t_float tVar10;
  t_atom a [6];
  t_atom local_98;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  t_symbol *local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_58;
  t_symbol *local_50;
  undefined4 local_48;
  undefined4 local_40;
  
  ptVar7 = &s__X;
  sel = canvas_class;
  p_Var2 = (_glist *)pd_findbyclass(&s__X,canvas_class);
  if (*s->s_name == '\0') {
    pcVar8 = "/SUBPATCH/";
    s = gensym("/SUBPATCH/");
    ptVar7 = (t_symbol *)pcVar8;
  }
  local_98.a_type = A_FLOAT;
  local_98.a_w.w_float = 0.0;
  local_88 = 1;
  local_80 = 0x42480000;
  local_78 = 1;
  local_70 = (t_symbol *)CONCAT44(local_70._4_4_,0x43e10000);
  local_68 = 1;
  local_60 = 0x43960000;
  local_58 = 2;
  local_48 = 1;
  local_40 = 0x3f800000;
  local_50 = s;
  gl = canvas_new(ptVar7,(t_symbol *)sel,6,&local_98);
  if (((p_Var2 == (_glist *)0x0) || (p_Var2->gl_editor == (t_editor *)0x0)) ||
     (x = p_Var2->gl_editor->e_connectbuf, x == (_binbuf *)0x0)) goto LAB_0013ac44;
  argv = binbuf_getvec(x);
  iVar1 = binbuf_getnatom(p_Var2->gl_editor->e_connectbuf);
  if (iVar1 == 7) {
    ptVar6 = (t_symbol *)0x0;
    ptVar7 = atom_getsymbolarg(0,7,argv);
    ptVar3 = gensym("#X");
    if (ptVar7 == ptVar3) {
      ptVar7 = atom_getsymbolarg(1,7,argv);
      ptVar3 = gensym("connect");
      ptVar6 = (t_symbol *)0x0;
      iVar1 = 0;
      if (ptVar7 == ptVar3) {
        p_Var4 = (_glist *)p_Var2->gl_list;
        if (p_Var4 != gl && p_Var4 != (_glist *)0x0) {
          iVar1 = 0;
          do {
            iVar1 = iVar1 + 1;
            p_Var4 = (_glist *)(p_Var4->gl_obj).te_g.g_next;
            if (p_Var4 == (_glist *)0x0) break;
          } while (p_Var4 != gl);
        }
        tVar10 = atom_getfloat(argv + 5);
        if ((int)tVar10 == 0) {
          tVar10 = atom_getfloat(argv + 4);
          if (iVar1 == (int)tVar10) {
            tVar10 = atom_getfloat(argv + 2);
            iVar1 = (int)tVar10;
            tVar10 = atom_getfloat(argv + 3);
            x_00 = p_Var2->gl_list;
            bVar9 = x_00 != (t_gobj *)0x0;
            if (0 < iVar1 && bVar9) {
              do {
                x_00 = x_00->g_next;
                bVar9 = x_00 != (_gobj *)0x0;
                if (iVar1 < 2) break;
                iVar1 = iVar1 + -1;
              } while (x_00 != (_gobj *)0x0);
            }
            if (bVar9) {
              ptVar5 = pd_checkobject(&x_00->g_pd);
              if (ptVar5 != (t_object *)0x0) {
                ptVar5 = pd_checkobject(&x_00->g_pd);
                iVar1 = obj_issignaloutlet(ptVar5,(int)tVar10);
                pcVar8 = "inlet~";
                if (iVar1 == 0) {
                  pcVar8 = "inlet";
                }
                ptVar6 = gensym(pcVar8);
                goto LAB_0013abd4;
              }
            }
          }
        }
        goto LAB_0013abd1;
      }
    }
  }
  else {
LAB_0013abd1:
    ptVar6 = (t_symbol *)0x0;
  }
LAB_0013abd4:
  if (ptVar6 != (t_symbol *)0x0) {
    local_98.a_type = A_FLOAT;
    local_98.a_w.w_index = 0x42140000;
    local_88 = 1;
    local_80 = 0x42140000;
    local_78 = 2;
    local_70 = ptVar6;
    ptVar7 = gensym("obj");
    canvas_obj(gl,ptVar7,3,&local_98);
    canvas_create_editor(gl);
    glist_noselect(gl);
    glist_select(gl,gl->gl_list);
  }
LAB_0013ac44:
  gl->gl_owner = p_Var2;
  canvas_pop(gl,1.0);
  return gl;
}

Assistant:

static void *subcanvas_new(t_symbol *s)
{
    t_atom a[6];
    t_canvas *x, *z = canvas_getcurrent();

    if (!*s->s_name) s = gensym("/SUBPATCH/");
    SETFLOAT(a+0, GLIST_DEFCANVASXLOC);
    SETFLOAT(a+1, GLIST_DEFCANVASYLOC);
    SETFLOAT(a+2, GLIST_DEFCANVASWIDTH);
    SETFLOAT(a+3, GLIST_DEFCANVASHEIGHT);
    SETSYMBOL(a+4, s);
    SETFLOAT(a+5, 1);
    x = canvas_new(0, 0, 6, a);

        /* check if subpatch is supposed to be connected (on the 1st inlet) */
    if(z && z->gl_editor && z->gl_editor->e_connectbuf)
    {
        t_atom*argv = binbuf_getvec(z->gl_editor->e_connectbuf);
        int argc = binbuf_getnatom(z->gl_editor->e_connectbuf);
        t_symbol *sob = 0;
        if ((argc == 7)
            && atom_getsymbolarg(0, argc, argv) == gensym("#X")
            && atom_getsymbolarg(1, argc, argv) == gensym("connect"))
        {
            int index2 = canvas_getindex(z, &x->gl_gobj);
            if (((int)atom_getfloat(argv+5) == 0)
                && (int)atom_getfloat(argv+4) == index2)
                {
                    int index1 = (int)atom_getfloat(argv+2);
                    int outno = (int)atom_getfloat(argv+3);
                    t_gobj*outobj=z->gl_list;
                        /* get handle to object */
                    while(index1-->0 && outobj)
                        outobj=outobj->g_next;
                    if(outobj && pd_checkobject(&outobj->g_pd))
                    {
                        if (obj_issignaloutlet(pd_checkobject(&outobj->g_pd), outno))
                            sob = gensym("inlet~");
                        else
                            sob = gensym("inlet");
                    }
                }
        }
        if(sob)
        {
                /* JMZ: weirdo hardcoded numbers, taken from
                 * glist_getnextxy(): 40
                 * and canvas_howputnew(): -3
                 */
            SETFLOAT(a+0, 37);
            SETFLOAT(a+1, 37);
            SETSYMBOL(a+2, sob);
            canvas_obj(x, gensym("obj"), 3, a);

                /* select the newly created inlet to continue autopatching */
            canvas_create_editor(x);
            glist_noselect(x);
            glist_select(x, x->gl_list);
        }
    }
    x->gl_owner = z;
    canvas_pop(x, 1);
    return (x);
}